

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O0

int ecp_mod_p384(mbedtls_mpi *N)

{
  char cVar1;
  uint local_bc;
  undefined1 local_88 [8];
  mbedtls_mpi_uint Cp [7];
  undefined1 local_48 [8];
  mbedtls_mpi C;
  size_t bits;
  size_t i;
  char local_16;
  char local_15;
  uint32_t cur;
  char cc;
  char c;
  mbedtls_mpi *pmStack_10;
  int ret;
  mbedtls_mpi *N_local;
  
  cur = 0xffffff92;
  local_15 = '\0';
  C.p = (mbedtls_mpi_uint *)0x180;
  local_48._0_4_ = 1;
  C.s = 7;
  C._4_4_ = 0;
  C.n = (size_t)local_88;
  pmStack_10 = N;
  memset(local_88,0,0x38);
  cur = mbedtls_mpi_grow(pmStack_10,0xc);
  if (cur == 0) {
    i._4_4_ = (uint)*pmStack_10->p;
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[6],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[10] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[10],&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[0xb] >> 0x20),&local_15);
    cVar1 = local_15;
    *pmStack_10->p = *pmStack_10->p & 0xffffffff00000000;
    *pmStack_10->p = (ulong)i._4_4_ | *pmStack_10->p;
    i._4_4_ = (uint)(*pmStack_10->p >> 0x20);
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[6] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[0xb],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[0xb] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[6],&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[10],&local_15);
    cVar1 = local_15;
    *pmStack_10->p = *pmStack_10->p & 0xffffffff;
    *pmStack_10->p = (ulong)i._4_4_ << 0x20 | *pmStack_10->p;
    i._4_4_ = (uint)pmStack_10->p[1];
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[7],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[0xb] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[6] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[10] >> 0x20),&local_15);
    cVar1 = local_15;
    pmStack_10->p[1] = pmStack_10->p[1] & 0xffffffff00000000;
    pmStack_10->p[1] = (ulong)i._4_4_ | pmStack_10->p[1];
    i._4_4_ = (uint)(pmStack_10->p[1] >> 0x20);
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[7] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[6],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[10],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[10] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[7],&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[0xb],&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[0xb] >> 0x20),&local_15);
    cVar1 = local_15;
    pmStack_10->p[1] = pmStack_10->p[1] & 0xffffffff;
    pmStack_10->p[1] = (ulong)i._4_4_ << 0x20 | pmStack_10->p[1];
    i._4_4_ = (uint)pmStack_10->p[2];
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[10] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[10] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[8],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[6] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[6],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[10],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[0xb],&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[7] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[0xb] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[0xb] >> 0x20),&local_15);
    cVar1 = local_15;
    pmStack_10->p[2] = pmStack_10->p[2] & 0xffffffff00000000;
    pmStack_10->p[2] = (ulong)i._4_4_ | pmStack_10->p[2];
    i._4_4_ = (uint)(pmStack_10->p[2] >> 0x20);
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[0xb],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[0xb],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[8] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[7],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[6] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[10] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[0xb] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[8],&local_15);
    cVar1 = local_15;
    pmStack_10->p[2] = pmStack_10->p[2] & 0xffffffff;
    pmStack_10->p[2] = (ulong)i._4_4_ << 0x20 | pmStack_10->p[2];
    i._4_4_ = (uint)pmStack_10->p[3];
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[0xb] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[0xb] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[9],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[7] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[7],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[0xb],&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[8] >> 0x20),&local_15);
    cVar1 = local_15;
    pmStack_10->p[3] = pmStack_10->p[3] & 0xffffffff00000000;
    pmStack_10->p[3] = (ulong)i._4_4_ | pmStack_10->p[3];
    i._4_4_ = (uint)(pmStack_10->p[3] >> 0x20);
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[9] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[8],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[7] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[0xb] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[9],&local_15);
    cVar1 = local_15;
    pmStack_10->p[3] = pmStack_10->p[3] & 0xffffffff;
    pmStack_10->p[3] = (ulong)i._4_4_ << 0x20 | pmStack_10->p[3];
    i._4_4_ = (uint)pmStack_10->p[4];
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[10],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[8] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[8],&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[9] >> 0x20),&local_15);
    cVar1 = local_15;
    pmStack_10->p[4] = pmStack_10->p[4] & 0xffffffff00000000;
    pmStack_10->p[4] = (ulong)i._4_4_ | pmStack_10->p[4];
    i._4_4_ = (uint)(pmStack_10->p[4] >> 0x20);
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[10] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[9],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[8] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[10],&local_15);
    cVar1 = local_15;
    pmStack_10->p[4] = pmStack_10->p[4] & 0xffffffff;
    pmStack_10->p[4] = (ulong)i._4_4_ << 0x20 | pmStack_10->p[4];
    i._4_4_ = (uint)pmStack_10->p[5];
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[0xb],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[9] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[9],&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[10] >> 0x20),&local_15);
    cVar1 = local_15;
    pmStack_10->p[5] = pmStack_10->p[5] & 0xffffffff00000000;
    pmStack_10->p[5] = (ulong)i._4_4_ | pmStack_10->p[5];
    i._4_4_ = (uint)(pmStack_10->p[5] >> 0x20);
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[0xb] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[10],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[9] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[0xb],&local_15);
    pmStack_10->p[5] = pmStack_10->p[5] & 0xffffffff;
    pmStack_10->p[5] = (ulong)i._4_4_ << 0x20 | pmStack_10->p[5];
    bits = 0xc;
    if (local_15 < '\x01') {
      local_bc = 0;
    }
    else {
      local_bc = (uint)local_15;
    }
    pmStack_10->p[6] = pmStack_10->p[6] & 0xffffffff00000000;
    pmStack_10->p[6] = (ulong)local_bc | pmStack_10->p[6];
    i._4_4_ = 0;
    while (bits = bits + 1, bits < pmStack_10->n << 1) {
      if ((bits & 1) == 0) {
        pmStack_10->p[bits >> 1] = pmStack_10->p[bits >> 1] & 0xffffffff00000000;
        pmStack_10->p[bits >> 1] = pmStack_10->p[bits >> 1];
      }
      else {
        pmStack_10->p[bits >> 1] = pmStack_10->p[bits >> 1] & 0xffffffff;
        pmStack_10->p[bits >> 1] = pmStack_10->p[bits >> 1];
      }
    }
    if (local_15 < '\0') {
      fix_negative(pmStack_10,local_15,(mbedtls_mpi *)local_48,(size_t)C.p);
    }
  }
  return cur;
}

Assistant:

static int ecp_mod_p384( mbedtls_mpi *N )
{
    INIT( 384 );

    ADD( 12 ); ADD( 21 ); ADD( 20 );
    SUB( 23 );                                              NEXT; // A0

    ADD( 13 ); ADD( 22 ); ADD( 23 );
    SUB( 12 ); SUB( 20 );                                   NEXT; // A2

    ADD( 14 ); ADD( 23 );
    SUB( 13 ); SUB( 21 );                                   NEXT; // A2

    ADD( 15 ); ADD( 12 ); ADD( 20 ); ADD( 21 );
    SUB( 14 ); SUB( 22 ); SUB( 23 );                        NEXT; // A3

    ADD( 21 ); ADD( 21 ); ADD( 16 ); ADD( 13 ); ADD( 12 ); ADD( 20 ); ADD( 22 );
    SUB( 15 ); SUB( 23 ); SUB( 23 );                        NEXT; // A4

    ADD( 22 ); ADD( 22 ); ADD( 17 ); ADD( 14 ); ADD( 13 ); ADD( 21 ); ADD( 23 );
    SUB( 16 );                                              NEXT; // A5

    ADD( 23 ); ADD( 23 ); ADD( 18 ); ADD( 15 ); ADD( 14 ); ADD( 22 );
    SUB( 17 );                                              NEXT; // A6

    ADD( 19 ); ADD( 16 ); ADD( 15 ); ADD( 23 );
    SUB( 18 );                                              NEXT; // A7

    ADD( 20 ); ADD( 17 ); ADD( 16 );
    SUB( 19 );                                              NEXT; // A8

    ADD( 21 ); ADD( 18 ); ADD( 17 );
    SUB( 20 );                                              NEXT; // A9

    ADD( 22 ); ADD( 19 ); ADD( 18 );
    SUB( 21 );                                              NEXT; // A10

    ADD( 23 ); ADD( 20 ); ADD( 19 );
    SUB( 22 );                                              LAST; // A11

cleanup:
    return( ret );
}